

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

Maybe<unsigned_long_long> __thiscall
kj::anon_unknown_55::tryParseUnsigned(anon_unknown_55 *this,StringPtr *s,unsigned_long_long max)

{
  char *pcVar1;
  int *piVar2;
  ulonglong uVar3;
  int __base;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2 aVar4;
  Maybe<unsigned_long_long> MVar5;
  char *endPtr;
  char *local_30;
  
  aVar4.value = max;
  if (1 < (s->content).size_) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar1 = (s->content).ptr;
    __base = 10;
    if (pcVar1[*pcVar1 == '-'] == '0') {
      __base = 10;
      if ((pcVar1[(ulong)(*pcVar1 == '-') + 1] & 0xdfU) == 0x58) {
        __base = 0x10;
      }
    }
    uVar3 = strtoull(pcVar1,&local_30,__base);
    pcVar1 = (s->content).ptr;
    aVar4.value = (long)pcVar1 + ((s->content).size_ - 1);
    if ((((local_30 == (char *)aVar4.value) && (*piVar2 != 0x22)) && (uVar3 <= max)) &&
       (*pcVar1 != '-')) {
      *this = (anon_unknown_55)0x1;
      *(ulonglong *)(this + 8) = uVar3;
      goto LAB_001b1b99;
    }
  }
  *this = (anon_unknown_55)0x0;
LAB_001b1b99:
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long_long>)MVar5.ptr;
}

Assistant:

Maybe<unsigned long long> tryParseUnsigned(const StringPtr& s, unsigned long long max) {
  if (s == nullptr) { return kj::none; } // String does not contain valid number.
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  if (endPtr != s.end() || errno == ERANGE || max < value || s[0] == '-') { return kj::none; }
  return value;
}